

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseMumpsCoverage.cxx
# Opt level: O2

bool __thiscall cmParseMumpsCoverage::ReadCoverageFile(cmParseMumpsCoverage *this,char *file)

{
  uint uVar1;
  cmCTest *this_00;
  bool bVar2;
  long lVar3;
  ostream *poVar4;
  string packages;
  char *local_430 [4];
  string path;
  string line;
  string type;
  ostringstream cmCTestLog_msg;
  ifstream in;
  uint auStack_218 [122];
  
  std::ifstream::ifstream(&in,file,_S_in);
  uVar1 = *(uint *)((long)auStack_218 + *(long *)(_in + -0x18));
  if ((uVar1 & 5) == 0) {
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    while( true ) {
      bVar2 = cmsys::SystemTools::GetLineFromStream((istream *)&in,&line,(bool *)0x0,-1);
      if (!bVar2) break;
      lVar3 = std::__cxx11::string::find((char)&line,0x3a);
      packages._M_dataplus._M_p = (pointer)&packages.field_2;
      packages._M_string_length = 0;
      packages.field_2._M_local_buf[0] = '\0';
      if (lVar3 != -1) {
        std::__cxx11::string::substr((ulong)&type,(ulong)&line);
        std::__cxx11::string::substr((ulong)&path,(ulong)&line);
        bVar2 = std::operator==(&type,"packages");
        if (bVar2) {
          LoadPackages(this,path._M_dataplus._M_p);
        }
        else {
          bVar2 = std::operator==(&type,"coverage_dir");
          if (bVar2) {
            (*this->_vptr_cmParseMumpsCoverage[2])(this,path._M_dataplus._M_p);
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
            poVar4 = std::operator<<((ostream *)&cmCTestLog_msg,
                                     "Parse Error in Mumps coverage file :\n");
            poVar4 = std::operator<<(poVar4,file);
            poVar4 = std::operator<<(poVar4,"\ntype: [");
            poVar4 = std::operator<<(poVar4,(string *)&type);
            poVar4 = std::operator<<(poVar4,"]\npath:[");
            poVar4 = std::operator<<(poVar4,(string *)&path);
            poVar4 = std::operator<<(poVar4,"]\ninput line: [");
            poVar4 = std::operator<<(poVar4,(string *)&line);
            std::operator<<(poVar4,"]\n");
            this_00 = this->CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(this_00,5,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmParseMumpsCoverage.cxx"
                         ,0x37,local_430[0],false);
            std::__cxx11::string::~string((string *)local_430);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
          }
        }
        std::__cxx11::string::~string((string *)&path);
        std::__cxx11::string::~string((string *)&type);
      }
      std::__cxx11::string::~string((string *)&packages);
    }
    std::__cxx11::string::~string((string *)&line);
  }
  std::ifstream::~ifstream(&in);
  return (uVar1 & 5) == 0;
}

Assistant:

bool cmParseMumpsCoverage::ReadCoverageFile(const char* file)
{
  // Read the gtm_coverage.mcov file, that has two lines of data:
  // packages:/full/path/to/Vista/Packages
  // coverage_dir:/full/path/to/dir/with/*.mcov
  cmsys::ifstream in(file);
  if(!in)
    {
    return false;
    }
  std::string line;
  while(cmSystemTools::GetLineFromStream(in, line))
    {
    std::string::size_type pos = line.find(':', 0);
    std::string packages;
    if(pos != std::string::npos)
      {
      std::string type = line.substr(0, pos);
      std::string path = line.substr(pos+1);
      if(type == "packages")
        {
        this->LoadPackages(path.c_str());
        }
      else if(type == "coverage_dir")
        {
        this->LoadCoverageData(path.c_str());
        }
      else
        {
        cmCTestLog(this->CTest, ERROR_MESSAGE,
                   "Parse Error in Mumps coverage file :\n"
                   << file <<
                   "\ntype: [" << type << "]\npath:[" << path << "]\n"
                   "input line: [" << line << "]\n");
        }
      }
    }
  return true;
}